

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_utility.cpp
# Opt level: O2

EncodeSignatureByDerResponseStruct *
cfd::js::api::UtilStructApi::EncodeSignatureByDer
          (EncodeSignatureByDerResponseStruct *__return_storage_ptr__,
          EncodeSignatureByDerRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::EncodeSignatureByDerResponseStruct_(const_cfd::js::api::EncodeSignatureByDerRequestStruct_&)>
  local_f8;
  EncodeSignatureByDerResponseStruct local_d8;
  
  EncodeSignatureByDerResponseStruct::EncodeSignatureByDerResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::EncodeSignatureByDerResponseStruct_(const_cfd::js::api::EncodeSignatureByDerRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_utility.cpp:211:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::EncodeSignatureByDerResponseStruct_(const_cfd::js::api::EncodeSignatureByDerRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_utility.cpp:211:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"EncodeSignatureByDer",&local_119);
  ExecuteStructApi<cfd::js::api::EncodeSignatureByDerRequestStruct,cfd::js::api::EncodeSignatureByDerResponseStruct>
            (&local_d8,(api *)request,(EncodeSignatureByDerRequestStruct *)&local_118,&local_f8,
             in_R8);
  EncodeSignatureByDerResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  EncodeSignatureByDerResponseStruct::~EncodeSignatureByDerResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

EncodeSignatureByDerResponseStruct UtilStructApi::EncodeSignatureByDer(
    const EncodeSignatureByDerRequestStruct& request) {
  auto call_func = [](const EncodeSignatureByDerRequestStruct& request)
      -> EncodeSignatureByDerResponseStruct {
    EncodeSignatureByDerResponseStruct result;

    SigHashType sighash_type = TransactionStructApiBase::ConvertSigHashType(
        request.sighash_type, request.sighash_anyone_can_pay,
        request.sighash_rangeproof);
    const ByteData der_signature =
        CryptoUtil::ConvertSignatureToDer(request.signature, sighash_type);

    result.signature = der_signature.GetHex();
    return result;
  };

  EncodeSignatureByDerResponseStruct result;
  result = ExecuteStructApi<
      EncodeSignatureByDerRequestStruct, EncodeSignatureByDerResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}